

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::Write
          (SerializationCloner<Js::StreamWriter> *this,BYTE *bytes,uint32 len)

{
  undefined4 local_24;
  uint local_20;
  uint32 padding;
  uint32 unalignedLen;
  uint32 len_local;
  BYTE *bytes_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  padding = len;
  _unalignedLen = bytes;
  bytes_local = (BYTE *)this;
  StreamWriter::Write<unsigned_int>(this->m_writer,&padding);
  StreamWriter::Write(this->m_writer,_unalignedLen,(ulong)padding);
  local_20 = padding & 3;
  if (local_20 != 0) {
    local_24 = 0;
    StreamWriter::Write(this->m_writer,&local_24,4 - (ulong)local_20);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::Write(const BYTE* bytes, uint32 len) const
    {
        m_writer->Write(len);
        m_writer->Write(bytes, len);
        uint32 unalignedLen = len % sizeof(uint32);
        if (unalignedLen)
        {
            uint32 padding = 0;
            m_writer->Write(&padding, sizeof(uint32) - unalignedLen);
        }
    }